

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgcrypto.hpp
# Opt level: O0

string * ws::wx_sha1(string *__return_storage_ptr__,string *str)

{
  uchar *puVar1;
  size_type n;
  MsgCryptoError *this;
  int local_88;
  char local_82 [2];
  int i;
  char tmp [8];
  allocator<char> local_59;
  string local_58;
  byte local_38 [8];
  uchar out [20];
  string *str_local;
  string *ret;
  
  memset(local_38,0,0x14);
  puVar1 = (uchar *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::c_str(str);
  n = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(str);
  puVar1 = SHA1(puVar1,n,local_38);
  if (puVar1 != (uchar *)0x0) {
    tmp[0] = '\0';
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    memset(local_82,0,8);
    for (local_88 = 0; local_88 < 0x14; local_88 = local_88 + 1) {
      snprintf(local_82,8,"%02x",(ulong)local_38[local_88]);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,local_82);
    }
    return __return_storage_ptr__;
  }
  tmp[1] = '\x01';
  this = (MsgCryptoError *)__cxa_allocate_exception(0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"sha1 error",&local_59);
  stack0xffffffffffffff88 = &PTR_s__workspace_llm4binary_github_lic_00276ed0;
  MsgCryptoError::MsgCryptoError(this,&local_58,(source_location)0x276ed0);
  tmp[1] = '\0';
  __cxa_throw(this,&MsgCryptoError::typeinfo,MsgCryptoError::~MsgCryptoError);
}

Assistant:

std::string wx_sha1(const std::string &str)
  {
    unsigned char out[SHA_DIGEST_LENGTH] = {0};
    if (SHA1((const unsigned char *) str.c_str(), str.size(), out) == nullptr)
    {
      throw MsgCryptoError("sha1 error");
    }
    
    std::string ret;
    char tmp[8] = {0};
    for (int i = 0; i < SHA_DIGEST_LENGTH; i++)
    {
      snprintf(tmp, sizeof(tmp), "%02x", 0xff & out[i]);
      ret.append(tmp);
    }
    return ret;
  }